

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

void deqp::gles31::bb::anon_unknown_11::generateValues
               (BufferLayout *layout,
               vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
               *blockPointers,deUint32 seed)

{
  long lVar1;
  int iVar2;
  DataType dataType;
  int iVar3;
  int iVar4;
  pointer pBVar5;
  pointer pBVar6;
  uint uVar7;
  uint uVar8;
  DataType DVar9;
  int iVar10;
  uint uVar11;
  deUint32 dVar12;
  uint uVar13;
  deBool dVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  Random rnd;
  int local_d8;
  ulong local_c0;
  ulong local_b8;
  deRandom local_90;
  vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  pointer local_70;
  ulong local_68;
  void *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_80 = blockPointers;
  deRandom_init(&local_90,seed);
  uVar8 = (uint)((ulong)((long)(layout->blocks).
                               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(layout->blocks).
                              super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar8) {
    uVar15 = 0;
    do {
      pBVar5 = (layout->blocks).
               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&pBVar5[uVar15].activeVarIndices.
                                             super__Vector_base<int,_std::allocator<int>_> + 8) -
                             *(long *)&pBVar5[uVar15].activeVarIndices.
                                       super__Vector_base<int,_std::allocator<int>_>) >> 2);
      if (0 < (int)uVar16) {
        local_70 = (local_80->
                   super__Vector_base<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar15;
        local_78 = &pBVar5[uVar15].activeVarIndices;
        local_68 = 0;
        do {
          iVar2 = *(int *)(*(long *)&(local_78->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl + local_68 * 4);
          pBVar6 = (layout->bufferVars).
                   super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = local_70->lastUnsizedArraySize;
          local_60 = local_70->ptr;
          DVar9 = glu::getDataTypeScalarType(pBVar6[iVar2].type);
          iVar10 = glu::getDataTypeScalarSize(pBVar6[iVar2].type);
          uVar11 = pBVar6[iVar2].arraySize;
          if (pBVar6[iVar2].arraySize == 0) {
            uVar11 = uVar13;
          }
          dataType = pBVar6[iVar2].type;
          iVar3 = pBVar6[iVar2].arrayStride;
          uVar7 = pBVar6[iVar2].topLevelArraySize;
          if (pBVar6[iVar2].topLevelArraySize == 0) {
            uVar7 = uVar13;
          }
          iVar4 = pBVar6[iVar2].topLevelArrayStride;
          bVar19 = dataType - TYPE_FLOAT_MAT2 < 9;
          bVar20 = dataType - TYPE_DOUBLE_MAT2 < 9;
          local_d8 = 1;
          if (bVar20 || bVar19) {
            if (pBVar6[iVar2].isRowMajor == true) {
              local_d8 = glu::getDataTypeMatrixNumRows(dataType);
            }
            else {
              local_d8 = glu::getDataTypeMatrixNumColumns(dataType);
            }
          }
          if (0 < (int)uVar7) {
            local_38 = (long)iVar10 / (long)local_d8 & 0xffffffff;
            local_48 = (ulong)uVar11;
            lVar1 = local_38 * 4;
            local_c0 = 0;
            local_58 = (ulong)uVar7;
            do {
              if (0 < (int)uVar11) {
                local_50 = (long)local_60 +
                           (long)(iVar4 * (int)local_c0) + (long)pBVar6[iVar2].offset;
                local_b8 = 0;
                do {
                  if (0 < local_d8) {
                    local_40 = iVar3 * (int)local_b8 + local_50;
                    iVar10 = 0;
                    do {
                      lVar17 = (long)(pBVar6[iVar2].matrixStride * iVar10);
                      if (!bVar20 && !bVar19) {
                        lVar17 = 0;
                      }
                      if (0 < (int)local_38) {
                        lVar17 = lVar17 + local_40;
                        lVar18 = 0;
                        do {
                          if ((int)DVar9 < 0x1f) {
                            if (DVar9 == TYPE_FLOAT) {
                              dVar12 = deRandom_getUint32(&local_90);
                              *(float *)(lVar17 + (int)lVar18) = (float)(int)(dVar12 % 0x13 - 9);
                            }
                            else if (DVar9 == TYPE_INT) {
                              dVar12 = deRandom_getUint32(&local_90);
                              uVar13 = dVar12 % 0x13 - 9;
                              goto LAB_016c9000;
                            }
                          }
                          else {
                            if (DVar9 == TYPE_UINT) {
                              dVar12 = deRandom_getUint32(&local_90);
                              uVar13 = dVar12 % 10;
                            }
                            else {
                              if (DVar9 != TYPE_BOOL) goto LAB_016c9004;
                              dVar14 = deRandom_getBool(&local_90);
                              uVar13 = 0;
                              if (dVar14 == 1) {
                                dVar12 = deRandom_getUint32(&local_90);
                                uVar13 = dVar12 | 1;
                              }
                            }
LAB_016c9000:
                            *(uint *)(lVar17 + (int)lVar18) = uVar13;
                          }
LAB_016c9004:
                          lVar18 = lVar18 + 4;
                        } while (lVar1 - lVar18 != 0);
                      }
                      iVar10 = iVar10 + 1;
                    } while (iVar10 != local_d8);
                  }
                  local_b8 = local_b8 + 1;
                } while (local_b8 != local_48);
              }
              local_c0 = local_c0 + 1;
            } while (local_c0 != local_58);
          }
          local_68 = local_68 + 1;
        } while (local_68 != (uVar16 & 0x7fffffff));
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar8 & 0x7fffffff));
  }
  return;
}

Assistant:

void generateValues (const BufferLayout& layout, const vector<BlockDataPtr>& blockPointers, deUint32 seed)
{
	de::Random	rnd			(seed);
	const int	numBlocks	= (int)layout.blocks.size();

	DE_ASSERT(numBlocks == (int)blockPointers.size());

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout	= layout.blocks[blockNdx];
		const BlockDataPtr&		blockPtr	= blockPointers[blockNdx];
		const int				numEntries	= (int)layout.blocks[blockNdx].activeVarIndices.size();

		for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		{
			const int					varNdx		= blockLayout.activeVarIndices[entryNdx];
			const BufferVarLayoutEntry&	varEntry	= layout.bufferVars[varNdx];

			generateValue(varEntry, blockPtr.lastUnsizedArraySize, blockPtr.ptr, rnd);
		}
	}
}